

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

void __thiscall FLispString::AddFloat(FLispString *this,double f,bool single)

{
  int iVar1;
  size_t sVar2;
  size_t local_50;
  size_t len;
  char buf [32];
  bool single_local;
  double f_local;
  FLispString *this_local;
  
  iVar1 = mysnprintf((char *)&len,0x20,"%.4f",f);
  sVar2 = (size_t)iVar1;
  local_50 = sVar2;
  if (single) {
    local_50 = sVar2 + 1;
    buf[sVar2 - 8] = 'f';
    buf[sVar2 - 7] = '\0';
  }
  Add(this,(char *)&len,local_50);
  return;
}

Assistant:

void AddFloat(double f, bool single)
	{
		char buf[32];
		size_t len = mysnprintf(buf, countof(buf), "%.4f", f);
		if (single)
		{
			buf[len++] = 'f';
			buf[len] = '\0';
		}
		Add(buf, len);
	}